

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__decode_samples_with_residual
                    (ma_dr_flac_bs *bs,ma_uint32 bitsPerSample,ma_uint32 blockSize,
                    ma_uint32 lpcOrder,ma_int32 lpcShift,ma_uint32 lpcPrecision,
                    ma_int32 *coefficients,ma_int32 *pDecodedSamples)

{
  ma_bool32 mVar1;
  uint bitsPerSample_00;
  ma_uint32 count;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  ma_int32 *in_RDI;
  ma_uint32 in_R8D;
  undefined4 in_R9D;
  ma_uint8 *in_stack_00000008;
  long in_stack_00000010;
  ma_uint8 unencodedBitsPerSample;
  ma_uint8 riceParam;
  ma_uint32 partitionsRemaining;
  ma_uint32 samplesInPartition;
  ma_uint8 partitionOrder;
  ma_uint8 residualMethod;
  ma_int32 *in_stack_00000050;
  ma_uint8 *in_stack_ffffffffffffffb0;
  long in_stack_ffffffffffffffb8;
  uint bitCount;
  ma_uint32 in_stack_ffffffffffffffc0;
  ma_int32 in_stack_ffffffffffffffc4;
  ma_uint32 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffda;
  char in_stack_ffffffffffffffdb;
  ma_bool32 local_4;
  
  mVar1 = ma_dr_flac__read_uint8
                    ((ma_dr_flac_bs *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_stack_ffffffffffffffb0);
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else if ((in_stack_ffffffffffffffdb == '\0') || (in_stack_ffffffffffffffdb == '\x01')) {
    in_stack_00000010 = in_stack_00000010 + (ulong)in_ECX * 4;
    mVar1 = ma_dr_flac__read_uint8
                      ((ma_dr_flac_bs *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_stack_ffffffffffffffb0);
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else if (in_stack_ffffffffffffffda < 9) {
      if (in_EDX / (uint)(1 << (in_stack_ffffffffffffffda & 0x1f)) < in_ECX) {
        local_4 = 0;
      }
      else {
        bitsPerSample_00 = in_EDX / (uint)(1 << (in_stack_ffffffffffffffda & 0x1f)) - in_ECX;
        count = 1 << (in_stack_ffffffffffffffda & 0x1f);
        while( true ) {
          in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
          bitCount = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
          if (in_stack_ffffffffffffffdb == '\0') {
            mVar1 = ma_dr_flac__read_uint8
                              ((ma_dr_flac_bs *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               bitCount,in_stack_ffffffffffffffb0);
            if (mVar1 == 0) {
              return 0;
            }
            if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\x0f') {
              in_stack_ffffffffffffffcc = CONCAT13(0xff,(int3)in_stack_ffffffffffffffcc);
            }
          }
          else if (in_stack_ffffffffffffffdb == '\x01') {
            mVar1 = ma_dr_flac__read_uint8
                              ((ma_dr_flac_bs *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               bitCount,in_stack_ffffffffffffffb0);
            if (mVar1 == 0) {
              return 0;
            }
            if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\x1f') {
              in_stack_ffffffffffffffcc = CONCAT13(0xff,(int3)in_stack_ffffffffffffffcc);
            }
          }
          if ((char)(in_stack_ffffffffffffffcc >> 0x18) == -1) {
            in_stack_ffffffffffffffcc = CONCAT13(0xff,(uint3)(ushort)in_stack_ffffffffffffffcc);
            mVar1 = ma_dr_flac__read_uint8
                              ((ma_dr_flac_bs *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               bitCount,in_stack_ffffffffffffffb0);
            if (mVar1 == 0) {
              return 0;
            }
            in_stack_ffffffffffffffb0 = in_stack_00000008;
            in_stack_ffffffffffffffb8 = in_stack_00000010;
            mVar1 = ma_dr_flac__decode_samples_with_residual__unencoded
                              ((ma_dr_flac_bs *)
                               CONCAT44(in_R9D,CONCAT13(in_stack_ffffffffffffffdb,
                                                        CONCAT12(in_stack_ffffffffffffffda,
                                                                 in_stack_ffffffffffffffd8))),
                               bitsPerSample_00,count,(ma_uint8)(in_stack_ffffffffffffffcc >> 0x18),
                               in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,blockSize,
                               (ma_int32 *)bs,in_stack_00000050);
            if (mVar1 == 0) {
              return 0;
            }
          }
          else {
            in_stack_ffffffffffffffb0 = in_stack_00000008;
            in_stack_ffffffffffffffb8 = in_stack_00000010;
            mVar1 = ma_dr_flac__decode_samples_with_residual__rice
                              ((ma_dr_flac_bs *)CONCAT44(bitsPerSample_00,count),
                               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                               (ma_uint8)((uint)in_stack_ffffffffffffffc4 >> 0x18),
                               in_stack_ffffffffffffffc0,
                               (ma_int32)((ulong)in_stack_00000010 >> 0x20),in_R8D,
                               (ma_int32 *)CONCAT44(in_ESI,in_EDX),in_RDI);
            if (mVar1 == 0) {
              return 0;
            }
          }
          in_stack_00000010 = in_stack_00000010 + (ulong)bitsPerSample_00 * 4;
          if (count == 1) break;
          count = count - 1;
          if (in_stack_ffffffffffffffda != 0) {
            bitsPerSample_00 = in_EDX / (uint)(1 << (in_stack_ffffffffffffffda & 0x1f));
          }
        }
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_flac__decode_samples_with_residual(ma_dr_flac_bs* bs, ma_uint32 bitsPerSample, ma_uint32 blockSize, ma_uint32 lpcOrder, ma_int32 lpcShift, ma_uint32 lpcPrecision, const ma_int32* coefficients, ma_int32* pDecodedSamples)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    MA_DR_FLAC_ASSERT(pDecodedSamples != NULL);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    pDecodedSamples += lpcOrder;
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) < lpcOrder) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - lpcOrder;
    partitionsRemaining = (1 << partitionOrder);
    for (;;) {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__decode_samples_with_residual__rice(bs, bitsPerSample, samplesInPartition, riceParam, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__decode_samples_with_residual__unencoded(bs, bitsPerSample, samplesInPartition, unencodedBitsPerSample, lpcOrder, lpcShift, lpcPrecision, coefficients, pDecodedSamples)) {
                return MA_FALSE;
            }
        }
        pDecodedSamples += samplesInPartition;
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        if (partitionOrder != 0) {
            samplesInPartition = blockSize / (1 << partitionOrder);
        }
    }
    return MA_TRUE;
}